

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_make_setter_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp type,sexp index)

{
  sexp psVar1;
  
  if ((((ulong)type & 3) == 0) && (type->tag == 1)) {
    type = (sexp)((ulong)(type->value).type.tag * 2 + 1);
  }
  if ((-1 < (long)type & (byte)type) == 0) {
    psVar1 = sexp_type_exception(ctx,self,2,type);
    return psVar1;
  }
  if ((-1 < (long)index & (byte)index) == 0) {
    psVar1 = sexp_type_exception(ctx,self,2,index);
    return psVar1;
  }
  psVar1 = sexp_make_opcode(ctx,self,name,(sexp)&DAT_00000013,(sexp)&DAT_00000065,
                            (sexp)&DAT_00000005,(sexp)&DAT_00000001,type,(sexp)&DAT_00000001,
                            (sexp)&DAT_00000001,type,index,(sexp_proc1)0x0);
  if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
    (psVar1->value).bytecode.max_depth = 0x43e;
  }
  return psVar1;
}

Assistant:

sexp sexp_make_setter_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp type, sexp index) {
  sexp res;
  if (sexp_typep(type)) type = sexp_make_fixnum(sexp_type_tag(type));
  if ((! sexp_fixnump(type))  || (sexp_unbox_fixnum(type) < 0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, type);
  if ((! sexp_fixnump(index)) || (sexp_unbox_fixnum(index) < 0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, index);
  res
    = sexp_make_opcode(ctx, self, name, sexp_make_fixnum(SEXP_OPC_SETTER),
                       sexp_make_fixnum(SEXP_OP_SLOT_SET), SEXP_TWO, SEXP_ZERO,
                       type, SEXP_ZERO, SEXP_ZERO, type, index, NULL);
  if (!sexp_exceptionp(res)) sexp_opcode_return_type(res) = SEXP_VOID;
  return res;
}